

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

void __thiscall ConfigurationTest::~ConfigurationTest(ConfigurationTest *this)

{
  code *pcVar1;
  ConfigurationTest *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void SetUp() override {
        using namespace std::chrono;

        // generate an almost unique filename
        std::uint64_t ts = duration_cast<microseconds>(high_resolution_clock::now().time_since_epoch()).count();
        filename = "ConfigurationTest." + std::to_string(ts);

        std::ofstream of(filename);
        if (!of.is_open()) {
            throw std::runtime_error("Can't create a temporary file: " + filename);
        }

        of << propertyFileContent;
        of.close();

        // set env variables
        setenv("AERON_ARCHIVE_MESSAGE_TIMEOUT", "123456", 1);
        setenv("AERON_ARCHIVE_CONTROL_CHANNEL", "qqqwwweee", 1);
        setenv("AERON_ARCHIVE_CONTROL_STREAM_ID", "42", 1);
        setenv("AERON_ARCHIVE_LOCAL_CONTROL_CHANNEL", "ipc:aeron", 1);
        setenv("AERON_ARCHIVE_LOCAL_CONTROL_STREAM_ID", "314", 1);
        setenv("AERON_ARCHIVE_CONTROL_RESPONSE_CHANNEL", "ResponsEconTrol", 1);
        setenv("AERON_ARCHIVE_CONTROL_RESPONSE_STREAM_ID", "271", 1);
        setenv("AERON_ARCHIVE_RECORDING_EVENTS_CHANNEL", "aaaaassss", 1);
        setenv("AERON_ARCHIVE_RECORDING_EVENTS_STREAM_ID", "144", 1);
        setenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_SPARSE", "0", 1);
        setenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_LENGTH", "1024", 1);
        setenv("AERON_ARCHIVE_CONTROL_MTU_LENGTH", "1812", 1);
    }